

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecUnary(Parser *this)

{
  _Alloc_hider _Var1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  CompileContext *pCVar5;
  size_type *psVar6;
  pointer *__ptr;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr_1;
  Token oper;
  optional<enact::Token> permission;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [24];
  bool local_98;
  optional<enact::Token> local_90;
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined4 local_30;
  undefined2 local_2c;
  
  uVar4 = (ulong)(in_RSI->m_current).type;
  if ((uVar4 < 0x3b) && ((0x4000000000c1000U >> (uVar4 & 0x3f) & 1) != 0)) {
    advance(in_RSI);
    local_c8._0_4_ = (in_RSI->m_previous).type;
    pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_c0._M_allocated_capacity = (size_type)local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_c8 + 8),pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length
              );
    local_b0._20_2_ = (in_RSI->m_previous).col;
    local_b0._16_4_ = (in_RSI->m_previous).line;
    parsePrecUnary((Parser *)local_58);
    pCVar5 = (CompileContext *)operator_new(0x40);
    _Var1._M_p = (pointer)((long)&local_90.super__Optional_base<enact::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<enact::Token,_true,_false,_false>.
                                  super__Optional_payload_base<enact::Token>._M_payload + 0x18);
    if ((undefined1 *)local_c0._M_allocated_capacity == local_b0) {
      local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_payload._32_4_ = local_b0._8_4_;
      local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_payload._36_4_ = local_b0._12_4_;
      local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p = _Var1
      ;
    }
    else {
      local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p =
           (_Alloc_hider)(_Alloc_hider)local_c0._M_allocated_capacity;
    }
    local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_payload._28_4_ = local_b0._4_4_;
    local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_payload._24_4_ = local_b0._0_4_;
    (pCVar5->m_source)._M_dataplus._M_p = (pointer)&PTR__UnaryExpr_00129630;
    (pCVar5->m_source)._M_string_length = local_58._0_8_;
    *(undefined4 *)&(pCVar5->m_source).field_2 = local_c8._0_4_;
    psVar6 = &(pCVar5->m_options).m_filename._M_string_length;
    *(size_type **)((long)&(pCVar5->m_source).field_2 + 8) = psVar6;
    if (local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
        super__Optional_payload<enact::Token,_true,_false,_false>.
        super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p ==
        (_Alloc_hider)_Var1._M_p) {
      *(undefined4 *)psVar6 = local_b0._0_4_;
      *(undefined4 *)((long)&(pCVar5->m_options).m_filename._M_string_length + 4) = local_b0._4_4_;
      *(undefined4 *)&(pCVar5->m_options).m_filename.field_2 =
           local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
           super__Optional_payload<enact::Token,_true,_false,_false>.
           super__Optional_payload_base<enact::Token>._M_payload._32_4_;
      *(undefined4 *)((long)&(pCVar5->m_options).m_filename.field_2 + 4) =
           local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
           super__Optional_payload<enact::Token,_true,_false,_false>.
           super__Optional_payload_base<enact::Token>._M_payload._36_4_;
    }
    else {
      ((_Alloc_hider *)((long)&(pCVar5->m_source).field_2 + 8))->_M_p =
           (pointer)local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
                    super__Optional_payload<enact::Token,_true,_false,_false>.
                    super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.
                    _M_dataplus._M_p;
      (pCVar5->m_options).m_filename._M_string_length =
           local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
           super__Optional_payload<enact::Token,_true,_false,_false>.
           super__Optional_payload_base<enact::Token>._M_payload._24_8_;
    }
    (pCVar5->m_options).m_filename._M_dataplus._M_p = (pointer)local_c0._8_8_;
    *(undefined2 *)((long)&(pCVar5->m_options).m_filename.field_2 + 0xc) = local_b0._20_2_;
    *(undefined4 *)((long)&(pCVar5->m_options).m_filename.field_2 + 8) = local_b0._16_4_;
    this->m_context = pCVar5;
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  }
  if ((in_RSI->m_current).type != AMPERSAND) {
    parsePrecCall(this);
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  }
  advance(in_RSI);
  local_58._0_4_ = (in_RSI->m_previous).type;
  pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  local_58._8_8_ = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_58 + 8),pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
  local_2c = (in_RSI->m_previous).col;
  local_30 = (in_RSI->m_previous).line;
  local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
  super__Optional_payload<enact::Token,_true,_false,_false>.
  super__Optional_payload_base<enact::Token>._M_engaged = false;
  if ((in_RSI->m_current).type == MUT) {
    advance(in_RSI);
LAB_00110695:
    std::optional<enact::Token>::operator=(&local_90,&in_RSI->m_previous);
  }
  else {
    local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_engaged = false;
    if ((in_RSI->m_current).type == IMM) {
      advance(in_RSI);
      goto LAB_00110695;
    }
  }
  local_98 = false;
  if ((in_RSI->m_current).type == SO) {
    advance(in_RSI);
  }
  else {
    local_98 = false;
    if ((in_RSI->m_current).type == RC) {
      advance(in_RSI);
    }
    else {
      local_98 = false;
      if ((in_RSI->m_current).type != GC) goto LAB_001106ff;
      advance(in_RSI);
    }
  }
  std::optional<enact::Token>::operator=((optional<enact::Token> *)local_c8,&in_RSI->m_previous);
LAB_001106ff:
  parsePrecUnary((Parser *)local_d8);
  std::
  make_unique<enact::ReferenceExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token,std::optional<enact::Token>,std::optional<enact::Token>>
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_d8 + 8),
             (Token *)local_d8,(optional<enact::Token> *)local_58,&local_90);
  uVar3 = local_d8._8_8_;
  local_d8._8_8_ = (pointer)0x0;
  this->m_context = (CompileContext *)uVar3;
  if ((CompileContext *)local_d8._0_8_ != (CompileContext *)0x0) {
    (**(code **)((((string *)local_d8._0_8_)->_M_dataplus)._M_p + 8))();
  }
  if ((local_98 == true) &&
     (local_98 = false, (undefined1 *)local_c0._M_allocated_capacity != local_b0)) {
    operator_delete((void *)local_c0._M_allocated_capacity,
                    CONCAT44(local_b0._4_4_,local_b0._0_4_) + 1);
  }
  if ((local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
       super__Optional_payload<enact::Token,_true,_false,_false>.
       super__Optional_payload_base<enact::Token>._M_engaged == true) &&
     (local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged = false,
     local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
     super__Optional_payload<enact::Token,_true,_false,_false>.
     super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p !=
     ((pointer)
     ((long)&local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_payload + 0x18U))._M_p)) {
    operator_delete((void *)local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
                            super__Optional_payload<enact::Token,_true,_false,_false>.
                            super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.
                            _M_dataplus._M_p,
                    local_90.super__Optional_base<enact::Token,_false,_false>._M_payload.
                    super__Optional_payload<enact::Token,_true,_false,_false>.
                    super__Optional_payload_base<enact::Token>._M_payload._24_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._8_8_ != &local_40) {
    operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecUnary() {
        if (consume(TokenType::MINUS) ||
            consume(TokenType::TILDE) ||
            consume(TokenType::STAR) ||
            consume(TokenType::NOT)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion
            return std::make_unique<UnaryExpr>(std::move(expr), std::move(oper));
        }

        if (consume(TokenType::AMPERSAND)) {
            Token oper = m_previous;

            std::optional<Token> permission;
            if (consume(TokenType::MUT) || consume(TokenType::IMM)) {
                permission = m_previous;
            }

            std::optional<Token> region;
            if (consume(TokenType::SO) || consume(TokenType::RC) || consume(TokenType::GC)) {
                region = m_previous;
            }

            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion

            return std::make_unique<ReferenceExpr>(
                    std::move(expr),
                    std::move(oper),
                    std::move(permission),
                    std::move(region));
        }

        return parsePrecCall();
    }